

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O3

void __thiscall
slang::SVInt::writeTo
          (SVInt *this,SmallVectorBase<char> *buffer,LiteralBase base,bool includeBase,
          bitwidth_t abbreviateThresholdBits)

{
  uint64_t *puVar1;
  pointer pcVar2;
  bool bVar3;
  void *pvVar4;
  logic_t lVar5;
  bitwidth_t bVar6;
  uint uVar7;
  ulong uVar8;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar9;
  pointer pcVar10;
  uint uVar11;
  uint uVar12;
  char *pcVar13;
  char *pcVar14;
  SmallVectorBase<char> *this_00;
  SVInt *pSVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  size_type *psVar21;
  LiteralBase LVar22;
  size_type sVar23;
  uint32_t value;
  byte bVar24;
  char cVar25;
  double dVar26;
  double __x;
  double __y;
  optional<unsigned_long> oVar27;
  SVInt divisor;
  SVInt remainder;
  SVInt quotient;
  SVInt tmp;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_a0;
  uint uStack_98;
  undefined1 uStack_94;
  byte bStack_93;
  byte local_89;
  SmallVectorBase<char> *local_88;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_80;
  uint local_78;
  undefined1 local_74;
  byte bStack_73;
  SVInt *local_70;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_68;
  uint local_60;
  ushort local_5c;
  size_type *local_58;
  size_type local_50;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_48;
  uint local_40;
  byte local_3b;
  ulong local_38;
  
  SVInt((SVInt *)&local_48,&this->super_SVIntStorage);
  local_70 = this;
  if (((((this->super_SVIntStorage).signFlag == true) &&
       ((this->super_SVIntStorage).unknownFlag == false)) &&
      (lVar5 = operator[](this,(this->super_SVIntStorage).bitWidth - 1), lVar5.value != '\0')) &&
     ((lVar5.value != '@' && (lVar5.value != 0x80)))) {
    operator-((SVInt *)&local_a0);
    operator=((SVInt *)&local_48,(SVInt *)&local_a0);
    if (((0x40 < uStack_98) || ((bStack_93 & 1) != 0)) &&
       (pvVar4 = (void *)CONCAT26(local_a0.val._6_2_,CONCAT51(local_a0.val._1_5_,local_a0.val._0_1_)
                                 ), pvVar4 != (void *)0x0)) {
      operator_delete__(pvVar4);
    }
    local_a0.val._0_1_ = 0x2d;
    SmallVectorBase<char>::emplace_back<char>(buffer,(char *)&local_a0.val);
  }
  local_88 = buffer;
  bVar6 = getActiveBits((SVInt *)&local_48);
  LVar22 = Decimal;
  if (bVar6 <= abbreviateThresholdBits) {
    LVar22 = base;
  }
  if (abbreviateThresholdBits < bVar6 || includeBase) {
    uintToStr(local_88,(local_70->super_SVIntStorage).bitWidth);
    local_a0.val._0_1_ = 0x27;
    SmallVectorBase<char>::emplace_back<char>(local_88,(char *)&local_a0.val);
    if ((local_70->super_SVIntStorage).signFlag == true) {
      local_a0.val._0_1_ = 0x73;
      SmallVectorBase<char>::emplace_back<char>(local_88,(char *)&local_a0.val);
    }
    this_00 = local_88;
    switch(LVar22) {
    case Binary:
      local_a0.val._0_1_ = 0x62;
      SmallVectorBase<char>::emplace_back<char>(local_88,(char *)&local_a0.val);
      local_58 = &this_00->len;
      local_50 = this_00->len;
      break;
    case Octal:
      local_a0.val._0_1_ = 0x6f;
      SmallVectorBase<char>::emplace_back<char>(local_88,(char *)&local_a0.val);
      local_58 = &this_00->len;
      local_50 = this_00->len;
      goto LAB_0018a643;
    case Decimal:
      local_a0.val._0_1_ = 100;
      SmallVectorBase<char>::emplace_back<char>(local_88,(char *)&local_a0.val);
      psVar21 = &this_00->len;
      sVar23 = this_00->len;
      goto LAB_0018a21d;
    case Hex:
      local_a0.val._0_1_ = 0x68;
      SmallVectorBase<char>::emplace_back<char>(local_88,(char *)&local_a0.val);
      local_58 = &this_00->len;
      local_50 = this_00->len;
      goto LAB_0018a610;
    default:
      goto switchD_0018a0dc_default;
    }
LAB_0018a138:
    iVar16 = 1;
    uVar20 = 1;
  }
  else {
switchD_0018a0dc_default:
    psVar21 = &local_88->len;
    sVar23 = local_88->len;
    switch(LVar22) {
    case Binary:
      local_58 = psVar21;
      local_50 = sVar23;
      goto LAB_0018a138;
    case Octal:
      local_58 = psVar21;
      local_50 = sVar23;
LAB_0018a643:
      uVar20 = 7;
      iVar16 = 3;
      break;
    case Decimal:
      this_00 = local_88;
LAB_0018a21d:
      if ((local_70->super_SVIntStorage).unknownFlag != true) {
        local_70 = (SVInt *)0x0;
        if (abbreviateThresholdBits <= bVar6 && bVar6 - abbreviateThresholdBits != 0) {
          local_70 = (SVInt *)log2_10;
          __y = log2_10;
          dVar26 = ceil((double)(bVar6 - abbreviateThresholdBits) / log2_10);
          pSVar15 = (SVInt *)0x5;
          if (5 < (uint)(long)dVar26) {
            pSVar15 = (SVInt *)((long)dVar26 & 0xffffffff);
          }
          dVar26 = ceil((double)(long)pSVar15 * (double)local_70);
          SVInt((SVInt *)&local_a0,(bitwidth_t)(long)dVar26,10,false);
          SVInt<unsigned_int,void>((SVInt *)&local_68,(uint)pSVar15);
          pow((SVInt *)&local_80,__x,__y);
          operator=((SVInt *)&local_a0,(SVInt *)&local_80);
          if (((0x40 < local_78) || ((bStack_73 & 1) != 0)) &&
             ((void *)CONCAT26(local_80.val._6_2_,local_80.val._0_6_) != (void *)0x0)) {
            operator_delete__((void *)CONCAT26(local_80.val._6_2_,local_80.val._0_6_));
          }
          if (((0x40 < local_60) || ((local_5c & 0x100) != 0)) &&
             ((void *)local_68.val != (void *)0x0)) {
            operator_delete__(local_68.pVal);
          }
          local_80.val._0_6_ = 0;
          local_80.val._6_2_ = 0;
          local_78 = 1;
          local_74 = 0;
          bStack_73 = 0;
          local_68.val = 0;
          local_60 = 1;
          local_5c = 0;
          divide((SVInt *)&local_48,(local_40 + 0x3f >> 6) << (local_3b & 0x1f),(SVInt *)&local_a0,
                 (uStack_98 + 0x3f >> 6) << (bStack_93 & 0x1f),(SVInt *)&local_68,(SVInt *)&local_80
                );
          operator=((SVInt *)&local_48,(SVInt *)&local_68);
          if (((0x40 < local_60) || ((local_5c & 0x100) != 0)) &&
             ((void *)local_68.val != (void *)0x0)) {
            operator_delete__(local_68.pVal);
          }
          if (((0x40 < local_78) || ((bStack_73 & 1) != 0)) &&
             ((void *)CONCAT26(local_80.val._6_2_,local_80.val._0_6_) != (void *)0x0)) {
            operator_delete__((void *)CONCAT26(local_80.val._6_2_,local_80.val._0_6_));
          }
          local_70 = pSVar15;
          if (((0x40 < uStack_98) || ((bStack_93 & 1) != 0)) &&
             (pvVar4 = (void *)CONCAT26(local_a0.val._6_2_,
                                        CONCAT51(local_a0.val._1_5_,local_a0.val._0_1_)),
             pvVar4 != (void *)0x0)) {
            operator_delete__(pvVar4);
          }
        }
        uStack_98 = 4;
        uStack_94 = 0;
        bStack_93 = 0;
        local_a0.val._0_1_ = 10;
        local_a0.val._1_5_ = 0;
        local_a0.val._6_2_ = 0;
        local_58 = psVar21;
        local_50 = sVar23;
        clearUnusedBits((SVInt *)&local_a0);
        local_38 = (ulong)uStack_98;
        uVar20 = uStack_98 + 0x3f;
        local_89 = bStack_93;
        bVar24 = bStack_93 & 0x1f;
        while( true ) {
          bStack_73 = 0;
          local_80.val._0_6_ = 0;
          local_80.val._6_2_ = 0;
          local_74 = 1;
          local_78 = 1;
          clearUnusedBits((SVInt *)&local_80);
          lVar5 = operator==((SVInt *)&local_48,(SVInt *)&local_80);
          if (((0x40 < local_78) || ((bStack_73 & 1) != 0)) &&
             ((void *)CONCAT26(local_80.val._6_2_,local_80.val._0_6_) != (void *)0x0)) {
            operator_delete__((void *)CONCAT26(local_80.val._6_2_,local_80.val._0_6_));
          }
          if (lVar5.value != '\0') break;
          local_80.val._0_6_ = 0;
          local_80.val._6_2_ = 0;
          local_78 = 1;
          local_74 = 0;
          bStack_73 = 0;
          local_68.val = 0;
          local_60 = 1;
          local_5c = 0;
          divide((SVInt *)&local_48,(local_40 + 0x3f >> 6) << (local_3b & 0x1f),(SVInt *)&local_a0,
                 (uVar20 >> 6) << bVar24,(SVInt *)&local_68,(SVInt *)&local_80);
          oVar27 = as<unsigned_long,void>((SVInt *)&local_80);
          if (((undefined1  [16])
               oVar27.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
              (undefined1  [16])0x0) {
            std::__throw_bad_optional_access();
          }
          if (9 < oVar27.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_long>._M_payload) {
            assert::assertFailed
                      ("digit < 10",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/numeric/SVInt.cpp"
                       ,0x30c,
                       "void slang::SVInt::writeTo(SmallVectorBase<char> &, LiteralBase, bool, bitwidth_t) const"
                      );
          }
          SmallVectorBase<char>::emplace_back<char_const&>
                    (local_88,"0123456789abcdef" +
                              oVar27.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                              super__Optional_payload_base<unsigned_long>._M_payload);
          operator=((SVInt *)&local_48,(SVInt *)&local_68);
          if (((0x40 < local_60) || ((local_5c & 0x100) != 0)) &&
             ((void *)local_68.val != (void *)0x0)) {
            operator_delete__(local_68.pVal);
          }
          if (((0x40 < local_78) || ((bStack_73 & 1) != 0)) &&
             ((void *)CONCAT26(local_80.val._6_2_,local_80.val._0_6_) != (void *)0x0)) {
            operator_delete__((void *)CONCAT26(local_80.val._6_2_,local_80.val._0_6_));
          }
        }
        value = (uint32_t)local_70;
        this_00 = local_88;
        sVar23 = local_50;
        psVar21 = local_58;
        if ((0x40 < (uint)local_38 || (local_89 & 1) != 0) &&
           (pvVar4 = (void *)CONCAT26(local_a0.val._6_2_,
                                      CONCAT51(local_a0.val._1_5_,local_a0.val._0_1_)),
           pvVar4 != (void *)0x0)) {
          operator_delete__(pvVar4);
          this_00 = local_88;
          sVar23 = local_50;
          psVar21 = local_58;
        }
        goto LAB_0018a871;
      }
      uVar11 = (local_70->super_SVIntStorage).bitWidth;
      uVar20 = uVar11 + 0x3f;
      uVar11 = uVar11 & 0x3f;
      uVar7 = uVar20 >> 6;
      uVar18 = (ulong)uVar7;
      uVar8 = -(ulong)(uVar11 == 0) | ~(-1L << (sbyte)uVar11);
      puVar1 = (local_70->super_SVIntStorage).field_0.pVal;
      uVar11 = uVar7 - 1;
      uVar17 = (ulong)uVar11;
      uVar19 = uVar17;
      if (uVar11 == 0) {
        uVar19 = 0;
        if (puVar1[uVar18] == uVar8) goto LAB_0018a92c;
LAB_0018a994:
        if ((~puVar1[uVar19] & puVar1[uVar7 * 2 - 1] & uVar8) == 0) {
          local_a0.val._0_1_ = 0x5a;
          SmallVectorBase<char>::emplace_back<char>(this_00,(char *)&local_a0.val);
        }
        else {
LAB_0018a9ab:
          local_a0.val._0_1_ = 0x58;
          SmallVectorBase<char>::emplace_back<char>(this_00,(char *)&local_a0.val);
        }
      }
      else {
        do {
          if (puVar1[uVar18] != 0xffffffffffffffff) goto LAB_0018a968;
          uVar18 = (ulong)((int)uVar18 + 1);
          uVar19 = uVar19 - 1;
        } while (uVar19 != 0);
        if (puVar1[uVar11 + uVar7] != uVar8) {
LAB_0018a968:
          if (uVar11 == 0) {
            uVar19 = 0;
          }
          else {
            uVar18 = 0;
            do {
              if ((puVar1[(uVar20 >> 6) + (int)uVar18] & ~puVar1[uVar18]) != 0) goto LAB_0018a9ab;
              uVar18 = uVar18 + 1;
              uVar19 = uVar17;
            } while (uVar17 != uVar18);
          }
          goto LAB_0018a994;
        }
        uVar18 = 0;
        do {
          if (puVar1[uVar18] != 0xffffffffffffffff) goto LAB_0018a947;
          uVar18 = uVar18 + 1;
          uVar19 = uVar17;
        } while (uVar17 != uVar18);
LAB_0018a92c:
        if (puVar1[uVar19] == uVar8) {
          local_a0.val._0_1_ = 0x7a;
          SmallVectorBase<char>::emplace_back<char>(this_00,(char *)&local_a0.val);
        }
        else {
LAB_0018a947:
          uVar19 = 0;
          uVar18 = uVar19;
          if (uVar11 != 0) {
            do {
              if (puVar1[uVar19] != 0) goto LAB_0018a968;
              uVar19 = uVar19 + 1;
              uVar18 = uVar17;
            } while (uVar17 != uVar19);
          }
          if (puVar1[uVar18] != 0) goto LAB_0018a968;
          local_a0.val._0_1_ = 0x78;
          SmallVectorBase<char>::emplace_back<char>(this_00,(char *)&local_a0.val);
        }
      }
      value = 0;
      goto LAB_0018a871;
    case Hex:
      local_58 = psVar21;
      local_50 = sVar23;
LAB_0018a610:
      uVar20 = 0xf;
      iVar16 = 4;
      break;
    default:
      iVar16 = 0;
      uVar20 = 0;
      local_58 = psVar21;
      local_50 = sVar23;
    }
  }
  uVar11 = local_40;
  bStack_93 = 0;
  local_a0.val._0_1_ = 0;
  local_a0.val._1_5_ = 0;
  local_a0.val._6_2_ = 0;
  uStack_94 = 1;
  uStack_98 = 1;
  clearUnusedBits((SVInt *)&local_a0);
  lVar5 = operator==((SVInt *)&local_48,(SVInt *)&local_a0);
  bVar24 = 0x80;
  if ((lVar5.value != '@') && (lVar5.value != 0x80)) {
    bVar24 = lVar5.value == '\0';
  }
  if (((0x40 < uStack_98) || ((bStack_93 & 1) != 0)) &&
     (pvVar4 = (void *)CONCAT26(local_a0.val._6_2_,CONCAT51(local_a0.val._1_5_,local_a0.val._0_1_)),
     pvVar4 != (void *)0x0)) {
    operator_delete__(pvVar4);
  }
  if (bVar24 == 0x80 || (bVar24 & 1) != 0) {
    do {
      uVar7 = ~(-1 << ((byte)uVar11 & 0x1f));
      if (iVar16 <= (int)uVar11) {
        uVar7 = uVar20;
      }
      uVar20 = uVar7;
      aVar9.pVal = (uint64_t *)&local_48;
      if ((local_3b & 1) != 0) {
        aVar9 = local_48;
      }
      if (0x40 < local_40) {
        aVar9 = local_48;
      }
      uVar7 = (uint)*aVar9.pVal & uVar20;
      if ((local_3b & 1) == 0) {
        SmallVectorBase<char>::emplace_back<char_const&>(local_88,"0123456789abcdef" + uVar7);
      }
      else {
        uVar12 = *(uint *)(local_48.pVal + ((local_70->super_SVIntStorage).bitWidth + 0x3f >> 6)) &
                 uVar20;
        if (uVar12 == 0) {
          SmallVectorBase<char>::emplace_back<char_const&>(local_88,"0123456789abcdef" + uVar7);
        }
        else if ((uVar12 == uVar20) && (uVar7 == 0)) {
          local_a0.val._0_1_ = 0x78;
          SmallVectorBase<char>::emplace_back<char>(local_88,(char *)&local_a0.val);
        }
        else if ((uVar12 == uVar20) && (uVar7 == uVar20)) {
          local_a0.val._0_1_ = 0x7a;
          SmallVectorBase<char>::emplace_back<char>(local_88,(char *)&local_a0.val);
        }
        else if ((uVar12 & ~uVar7) == 0) {
          local_a0.val._0_1_ = 0x5a;
          SmallVectorBase<char>::emplace_back<char>(local_88,(char *)&local_a0.val);
        }
        else {
          local_a0.val._0_1_ = 0x58;
          SmallVectorBase<char>::emplace_back<char>(local_88,(char *)&local_a0.val);
        }
      }
      lshr((SVInt *)&local_a0,(bitwidth_t)&local_48);
      operator=((SVInt *)&local_48,(SVInt *)&local_a0);
      if (((0x40 < uStack_98) || ((bStack_93 & 1) != 0)) &&
         (pvVar4 = (void *)CONCAT26(local_a0.val._6_2_,
                                    CONCAT51(local_a0.val._1_5_,local_a0.val._0_1_)),
         pvVar4 != (void *)0x0)) {
        operator_delete__(pvVar4);
      }
      bStack_93 = 0;
      local_a0.val._0_1_ = 0;
      local_a0.val._1_5_ = 0;
      local_a0.val._6_2_ = 0;
      uStack_94 = 1;
      uStack_98 = 1;
      clearUnusedBits((SVInt *)&local_a0);
      lVar5 = operator==((SVInt *)&local_48,(SVInt *)&local_a0);
      cVar25 = -0x80;
      bVar3 = false;
      if ((lVar5.value != '@') && (lVar5.value != 0x80)) {
        cVar25 = lVar5.value == '\0';
        bVar3 = (bool)cVar25;
      }
      if (((0x40 < uStack_98) || ((bStack_93 & 1) != 0)) &&
         (pvVar4 = (void *)CONCAT26(local_a0.val._6_2_,
                                    CONCAT51(local_a0.val._1_5_,local_a0.val._0_1_)),
         pvVar4 != (void *)0x0)) {
        operator_delete__(pvVar4);
      }
      uVar11 = uVar11 - iVar16;
    } while ((bool)(cVar25 == -0x80 | bVar3));
  }
  value = 0;
  this_00 = local_88;
  sVar23 = local_50;
  psVar21 = local_58;
LAB_0018a871:
  if (sVar23 == *psVar21) {
    local_a0.val._0_1_ = 0x30;
    SmallVectorBase<char>::emplace_back<char>(this_00,(char *)&local_a0.val);
  }
  else {
    pcVar2 = this_00->data_;
    pcVar10 = pcVar2 + (*psVar21 - 1);
    if (pcVar2 + sVar23 < pcVar10) {
      pcVar14 = pcVar2 + sVar23;
      do {
        pcVar13 = pcVar14 + 1;
        cVar25 = *pcVar14;
        *pcVar14 = *pcVar10;
        *pcVar10 = cVar25;
        pcVar10 = pcVar10 + -1;
        pcVar14 = pcVar13;
      } while (pcVar13 < pcVar10);
    }
    if (value != 0) {
      sVar23 = this_00->len + 4;
      SmallVectorBase<char>::reserve(this_00,sVar23);
      builtin_strncpy(this_00->data_ + this_00->len,"...e",4);
      this_00->len = sVar23;
      uintToStr(this_00,value);
    }
  }
  if (((0x40 < local_40) || ((local_3b & 1) != 0)) &&
     ((anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)local_48.val !=
      (anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)0x0)) {
    operator_delete__(local_48.pVal);
  }
  return;
}

Assistant:

void SVInt::writeTo(SmallVectorBase<char>& buffer, LiteralBase base, bool includeBase,
                    bitwidth_t abbreviateThresholdBits) const {
    // negative sign if necessary
    SVInt tmp(*this);
    if (signFlag && !unknownFlag && isNegative()) {
        tmp = -tmp;
        buffer.push_back('-');
    }

    // If the number is larger than the threshold to abbreviate,
    // force it to print as a decimal.
    bitwidth_t activeBits = tmp.getActiveBits();
    if (activeBits > abbreviateThresholdBits) {
        includeBase = true;
        base = LiteralBase::Decimal;
    }

    if (includeBase) {
        uintToStr(buffer, bitWidth);
        buffer.push_back('\'');
        if (signFlag)
            buffer.push_back('s');
        switch (base) {
            case LiteralBase::Binary:
                buffer.push_back('b');
                break;
            case LiteralBase::Octal:
                buffer.push_back('o');
                break;
            case LiteralBase::Decimal:
                buffer.push_back('d');
                break;
            case LiteralBase::Hex:
                buffer.push_back('h');
                break;
        }
    }

    uint32_t base10Exponent = 0;
    size_t startOffset = buffer.size();
    static const char Digits[] = "0123456789abcdef";
    if (base == LiteralBase::Decimal) {
        // decimal numbers that have unknown values only print as a single letter,
        // with the following rules:
        // - If all bits are unknown, print 'x'
        // - If all bits are high impendance, print 'z'
        // - If some bits are unknown, print 'X'
        // - Otherwise, if some bits are high impedance , print 'Z'
        if (unknownFlag) {
            uint64_t mask;
            bitwidth_t bitsInMsw;
            uint32_t words = getNumWords(bitWidth, false);
            getTopWordMask(bitsInMsw, mask);

            auto all = [&](uint32_t start, uint64_t v) {
                for (uint32_t i = 0; i < words - 1; i++) {
                    if (pVal[start + i] != v)
                        return false;
                }

                return pVal[start + words - 1] == (mask & v);
            };

            auto anyXs = [&]() {
                for (uint32_t i = 0; i < words - 1; i++) {
                    if ((~pVal[i] & pVal[i + words]) != 0)
                        return true;
                }

                return (~pVal[words - 1] & mask & pVal[words * 2 - 1]) != 0;
            };

            bool upperOnes = all(words, UINT64_MAX);
            if (upperOnes && all(0, UINT64_MAX))
                buffer.push_back('z');
            else if (upperOnes && all(0, 0))
                buffer.push_back('x');
            else if (anyXs())
                buffer.push_back('X');
            else
                buffer.push_back('Z');
        }
        else {
            // Limit the size of the output string based on the given threshold.
            if (activeBits > abbreviateThresholdBits) {
                base10Exponent =
                    std::max(5u, (uint32_t)ceil((activeBits - abbreviateThresholdBits) / log2_10));
                SVInt divisor(bitwidth_t(ceil(base10Exponent * log2_10)), 10, false);
                divisor = divisor.pow(base10Exponent);

                SVInt remainder;
                SVInt quotient;
                divide(tmp, tmp.getNumWords(), divisor, divisor.getNumWords(), &quotient,
                       &remainder);
                tmp = quotient;
            }

            // repeatedly divide by 10 to get each digit
            SVInt divisor(4, 10, false);
            while (tmp != 0) {
                SVInt remainder;
                SVInt quotient;
                divide(tmp, tmp.getNumWords(), divisor, divisor.getNumWords(), &quotient,
                       &remainder);
                uint64_t digit = remainder.as<uint64_t>().value();
                ASSERT(digit < 10);
                buffer.push_back(Digits[digit]);
                tmp = quotient;
            }
        }
    }
    else {
        // for bases 2, 8, and 16 we can just shift instead of dividing
        uint32_t shiftAmount = 0;
        uint32_t maskAmount = 0;
        switch (base) {
            case LiteralBase::Binary:
                shiftAmount = 1;
                maskAmount = 1;
                break;
            case LiteralBase::Octal:
                shiftAmount = 3;
                maskAmount = 7;
                break;
            case LiteralBase::Hex:
                shiftAmount = 4;
                maskAmount = 15;
                break;
            case LiteralBase::Decimal:
                ASSUME_UNREACHABLE;
        }

        // if we have unknown values here, the comparison will return X
        // we want to keep going so that we print the unknowns
        int bitsLeft = int(tmp.getBitWidth());
        logic_t x = tmp != 0;
        while (x || x.isUnknown()) {
            if (bitsLeft < int(shiftAmount))
                maskAmount = (1 << bitsLeft) - 1;

            uint32_t digit = uint32_t(tmp.getRawData()[0]) & maskAmount;
            if (!tmp.unknownFlag)
                buffer.push_back(Digits[digit]);
            else {
                uint32_t u = uint32_t(tmp.pVal[getNumWords(bitWidth, false)]) & maskAmount;
                if (!u)
                    buffer.push_back(Digits[digit]);
                else if (u == maskAmount && (digit & maskAmount) == 0)
                    buffer.push_back('x');
                else if (u == maskAmount && digit == maskAmount)
                    buffer.push_back('z');
                else if (~digit & u)
                    buffer.push_back('X');
                else
                    buffer.push_back('Z');
            }
            // this shift might shift away the unknown digits, at which point
            // it converts back to being a normal 2-state value
            tmp = tmp.lshr(shiftAmount);
            bitsLeft -= int(shiftAmount);
            x = tmp != 0;
        }
    }

    // no digits means this is zero
    if (startOffset == buffer.size())
        buffer.push_back('0');
    else {
        // reverse the digits
        std::reverse(buffer.begin() + startOffset, buffer.end());
        if (base10Exponent > 0) {
            buffer.append("...e"sv);
            uintToStr(buffer, base10Exponent);
        }
    }
}